

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
duckdb_fmt::v6::
format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_format_specs(format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                  *this,char *begin,char *end)

{
  bool bVar1;
  undefined8 uVar2;
  iterator it;
  char *in_RDX;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDI;
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  f;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *in_stack_fffffffffffffef8;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *this_00;
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>
  *in_stack_ffffffffffffff00;
  allocator *paVar3;
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_stack_ffffffffffffff10;
  format_specs *in_stack_ffffffffffffff18;
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>
  *in_stack_ffffffffffffff20;
  context_type *in_stack_ffffffffffffff28;
  arg_formatter<duckdb_fmt::v6::buffer_range<char>_> *in_stack_ffffffffffffff30;
  allocator local_a9;
  string local_a8 [24];
  basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffff70;
  arg_formatter<duckdb_fmt::v6::buffer_range<char>_> *in_stack_ffffffffffffff78;
  custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  local_30;
  char *local_20;
  char *local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  advance_to<char,duckdb_fmt::v6::internal::error_handler>
            ((basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *)
             in_stack_ffffffffffffff10,(char *)in_RDI);
  internal::
  custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  ::custom_formatter(&local_30,
                     (basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *)
                     &in_RDI->parse_context_,
                     (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                      *)&in_RDI[1].parse_context_);
  bVar1 = visit_format_arg<duckdb_fmt::v6::internal::custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>&,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (bVar1) {
    local_8 = basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>::begin
                        (in_stack_ffffffffffffff00);
  }
  else {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)in_stack_ffffffffffffff00);
    internal::
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::specs_handler(&in_stack_ffffffffffffff10->
                     super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                    ,(basic_format_specs<char> *)in_RDI,in_stack_ffffffffffffff00,
                    in_stack_fffffffffffffef8);
    basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::type((basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *)&in_RDI[3].parse_context_);
    internal::
    specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
    ::specs_checker(in_stack_ffffffffffffff10,in_RDI,
                    (type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    local_18 = internal::
               parse_format_specs<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                         ((char *)in_RDI,(char *)in_stack_ffffffffffffff00,
                          (specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                           *)in_stack_fffffffffffffef8);
    if ((local_18 == local_20) || (*local_18 != '}')) {
      paVar3 = &local_a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"missing \'}\' in format string",paVar3);
      uVar2 = duckdb_fmt::v6::internal::error_handler::on_error(in_RDI,local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      _Unwind_Resume(uVar2);
    }
    advance_to<char,duckdb_fmt::v6::internal::error_handler>
              ((basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *)
               in_stack_ffffffffffffff10,(char *)in_RDI);
    this_00 = (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
               *)&in_RDI[1].parse_context_;
    arg_formatter<duckdb_fmt::v6::buffer_range<char>_>::arg_formatter
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    it = visit_format_arg<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                   (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>::
    advance_to(this_00,(iterator)it.container);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const Char* on_format_specs(const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    internal::custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    using parse_context_t = basic_format_parse_context<Char>;
    internal::specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }